

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BinsSelectExpressionSyntax *args_2;
  BinaryBinsSelectExprSyntax *pBVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  not_null<slang::syntax::BinsSelectExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::BinsSelectExpressionSyntax_*> *)0x58bd16);
  args_2 = deepClone<slang::syntax::BinsSelectExpressionSyntax>
                     ((BinsSelectExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::BinsSelectExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::BinsSelectExpressionSyntax_*> *)0x58bd53);
  deepClone<slang::syntax::BinsSelectExpressionSyntax>
            ((BinsSelectExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinaryBinsSelectExprSyntax,slang::syntax::BinsSelectExpressionSyntax&,slang::parsing::Token,slang::syntax::BinsSelectExpressionSyntax&>
                     (this,(BinsSelectExpressionSyntax *)TVar2.info,TVar2._0_8_,args_2);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinaryBinsSelectExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinaryBinsSelectExprSyntax>(
        *deepClone<BinsSelectExpressionSyntax>(*node.left, alloc),
        node.op.deepClone(alloc),
        *deepClone<BinsSelectExpressionSyntax>(*node.right, alloc)
    );
}